

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_verify(secp256k1_fe *a)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  undefined8 uStack_10;
  
  uVar1 = a->magnitude;
  if ((ulong)uVar1 < 0x21) {
    uVar2 = a->normalized;
    if (uVar2 < 2) {
      if (uVar2 == 0) {
        lVar3 = (ulong)uVar1 * 2;
      }
      else {
        if (1 < uVar1) {
          pcVar4 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
          ;
          pcVar5 = "test condition failed: a->magnitude <= 1";
          uStack_10 = 0xaa;
          goto LAB_0010bedd;
        }
        lVar3 = 1;
      }
      uVar6 = lVar3 * 0xfffffffffffff;
      if (uVar6 < a->n[0]) {
        pcVar5 = "test condition failed: d[0] <= 0xFFFFFFFFFFFFFULL * m";
        uStack_10 = 0x1a;
      }
      else if (uVar6 < a->n[1]) {
        pcVar5 = "test condition failed: d[1] <= 0xFFFFFFFFFFFFFULL * m";
        uStack_10 = 0x1b;
      }
      else if (uVar6 < a->n[2]) {
        pcVar5 = "test condition failed: d[2] <= 0xFFFFFFFFFFFFFULL * m";
        uStack_10 = 0x1c;
      }
      else if (uVar6 < a->n[3]) {
        pcVar5 = "test condition failed: d[3] <= 0xFFFFFFFFFFFFFULL * m";
        uStack_10 = 0x1d;
      }
      else if ((ulong)(lVar3 * 0xffffffffffff) < a->n[4]) {
        pcVar5 = "test condition failed: d[4] <= 0x0FFFFFFFFFFFFULL * m";
        uStack_10 = 0x1e;
      }
      else {
        if (((a->n[4] != 0xffffffffffff || uVar2 == 0) || (a->n[0] < 0xffffefffffc2f)) ||
           ((a->n[2] & a->n[1] & a->n[3]) != 0xfffffffffffff)) {
          return;
        }
        pcVar5 = "test condition failed: d[0] < 0xFFFFEFFFFFC2FULL";
        uStack_10 = 0x21;
      }
      pcVar4 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_5x52_impl.h"
      ;
    }
    else {
      pcVar4 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
      ;
      pcVar5 = "test condition failed: (a->normalized == 0) || (a->normalized == 1)";
      uStack_10 = 0xa8;
    }
  }
  else {
    pcVar4 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
    ;
    pcVar5 = "test condition failed: (a->magnitude >= 0) && (a->magnitude <= 32)";
    uStack_10 = 0xa6;
  }
LAB_0010bedd:
  fprintf(_stderr,"%s:%d: %s\n",pcVar4,uStack_10,pcVar5);
  abort();
}

Assistant:

static void secp256k1_fe_verify(const secp256k1_fe *a) {
    /* Magnitude between 0 and 32. */
    VERIFY_CHECK((a->magnitude >= 0) && (a->magnitude <= 32));
    /* Normalized is 0 or 1. */
    VERIFY_CHECK((a->normalized == 0) || (a->normalized == 1));
    /* If normalized, magnitude must be 0 or 1. */
    if (a->normalized) VERIFY_CHECK(a->magnitude <= 1);
    /* Invoke implementation-specific checks. */
    secp256k1_fe_impl_verify(a);
}